

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O1

int secp256k1_eckey_pubkey_tweak_add(secp256k1_ge *key,secp256k1_scalar *tweak)

{
  bool bVar1;
  secp256k1_gej pt;
  secp256k1_gej local_98;
  
  local_98.infinity = key->infinity;
  local_98.x.n[0] = (key->x).n[0];
  local_98.x.n[1] = (key->x).n[1];
  local_98.x.n[2] = (key->x).n[2];
  local_98.x.n[3] = (key->x).n[3];
  local_98.x.n[4] = (key->x).n[4];
  local_98.y.n[0] = (key->y).n[0];
  local_98.y.n[1] = (key->y).n[1];
  local_98.y.n[2] = (key->y).n[2];
  local_98.y.n[3] = (key->y).n[3];
  local_98.y.n[4] = (key->y).n[4];
  local_98.z.n[0] = 1;
  local_98.z.n[1] = 0;
  local_98.z.n[2] = 0;
  local_98.z.n[3] = 0;
  local_98.z.n[4] = 0;
  secp256k1_ecmult(&local_98,&local_98,&secp256k1_scalar_one,tweak);
  bVar1 = local_98.infinity == 0;
  if (bVar1) {
    secp256k1_ge_set_gej(key,&local_98);
  }
  return (uint)bVar1;
}

Assistant:

static int secp256k1_eckey_pubkey_tweak_add(secp256k1_ge *key, const secp256k1_scalar *tweak) {
    secp256k1_gej pt;
    secp256k1_gej_set_ge(&pt, key);
    secp256k1_ecmult(&pt, &pt, &secp256k1_scalar_one, tweak);

    if (secp256k1_gej_is_infinity(&pt)) {
        return 0;
    }
    secp256k1_ge_set_gej(key, &pt);
    return 1;
}